

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

bool __thiscall Assimp::Importer::SetPropertyFloat(Importer *this,char *szName,ai_real iValue)

{
  bool bVar1;
  float local_4;
  
  if (this->pimpl != (ImporterPimpl *)0x0) {
    bVar1 = SetGenericProperty<float>(&this->pimpl->mFloatProperties,szName,&local_4);
    return bVar1;
  }
  __assert_fail("nullptr != pimpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                ,0x3ff,"bool Assimp::Importer::SetPropertyFloat(const char *, ai_real)");
}

Assistant:

bool Importer::SetPropertyFloat(const char* szName, ai_real iValue) {
    ai_assert(nullptr != pimpl);
    
    bool existing;
    ASSIMP_BEGIN_EXCEPTION_REGION();
        existing = SetGenericProperty<ai_real>(pimpl->mFloatProperties, szName,iValue);
    ASSIMP_END_EXCEPTION_REGION(bool);
    return existing;
}